

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_CryptoError.h
# Opt level: O3

bignum_st *
axl::cry::completeWithLastCryptoError<bignum_st*>(bignum_st *result,bignum_st *failResult)

{
  ulong code;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> BStack_28;
  
  if (result == failResult) {
    code = ERR_peek_last_error();
    CryptoError::CryptoError((CryptoError *)&BStack_28,code);
    err::setError((ErrorRef *)&BStack_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&BStack_28);
  }
  return result;
}

Assistant:

T
completeWithLastCryptoError(
	T result,
	T failResult
) {
	if (result == failResult)
		setLastCryptoError();

	return result;
}